

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

ndicapi * ndiOpenNetwork(char *hostname,int port)

{
  char *__src;
  bool bVar1;
  size_t sVar2;
  void *pvVar3;
  char *pcVar4;
  int connected;
  ndicapi *device;
  NDISocketHandle socket;
  int port_local;
  char *hostname_local;
  
  device._4_4_ = port;
  _socket = hostname;
  bVar1 = ndiSocketOpen(hostname,port,(NDISocketHandle *)&device);
  if (((int)device == -1) || (bVar1 == 0xffffffff)) {
    hostname_local = (char *)0x0;
  }
  else {
    hostname_local = (char *)malloc(0x4588);
    if (hostname_local == (char *)0x0) {
      ndiSocketClose((int)device);
      hostname_local = (char *)0x0;
    }
    else {
      memset(hostname_local,0,0x4588);
      sVar2 = strlen(_socket);
      pvVar3 = operator_new__(sVar2 + 1);
      __src = _socket;
      *(void **)(hostname_local + 0x18) = pvVar3;
      pcVar4 = *(char **)(hostname_local + 0x18);
      sVar2 = strlen(_socket);
      pcVar4 = strncpy(pcVar4,__src,sVar2);
      *(char **)(hostname_local + 0x18) = pcVar4;
      *(int *)(hostname_local + 0x20) = device._4_4_;
      *(int *)(hostname_local + 0x10) = (int)device;
      hostname_local[0] = -1;
      hostname_local[1] = -1;
      hostname_local[2] = -1;
      hostname_local[3] = -1;
      hostname_local[8] = '\0';
      hostname_local[9] = '\0';
      hostname_local[10] = '\0';
      hostname_local[0xb] = '\0';
      hostname_local[0xc] = '\0';
      hostname_local[0xd] = '\0';
      hostname_local[0xe] = '\0';
      hostname_local[0xf] = '\0';
      pvVar3 = malloc(0x800);
      *(void **)(hostname_local + 0x28) = pvVar3;
      pvVar3 = malloc(0x800);
      *(void **)(hostname_local + 0x30) = pvVar3;
      pvVar3 = malloc(0x800);
      *(void **)(hostname_local + 0x80) = pvVar3;
      memset(*(void **)(hostname_local + 0x28),0,0x800);
      memset(*(void **)(hostname_local + 0x30),0,0x800);
      memset(*(void **)(hostname_local + 0x80),0,0x800);
    }
  }
  return (ndicapi *)hostname_local;
}

Assistant:

ndicapiExport ndicapi* ndiOpenNetwork(const char* hostname, int port)
{
  NDISocketHandle socket;
  ndicapi* device;

  int connected = ndiSocketOpen(hostname, port, socket);

  if (socket == -1 || connected == -1)
  {
    return NULL;
  }

  device = (ndicapi*)malloc(sizeof(ndicapi));

  if (device == 0)
  {
    ndiSocketClose(socket);
    return NULL;
  }

  memset(device, 0, sizeof(ndicapi));
  device->Hostname = new char[strlen(hostname) + 1];
  device->Hostname = strncpy(device->Hostname, hostname, strlen(hostname));
  device->Port = port;
  device->Socket = socket;
  device->SerialDevice = NDI_INVALID_HANDLE;
  device->SerialDeviceName = NULL;

  // allocate the buffers
  device->Command = (char*)malloc(2048);
  device->Reply = (char*)malloc(2048);
  device->ReplyNoCRC = (char*)malloc(2048);

  // initialize the allocated memory
  memset(device->Command, 0, 2048);
  memset(device->Reply, 0, 2048);
  memset(device->ReplyNoCRC, 0, 2048);

  return device;
}